

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall ASDCP::MXF::DescriptiveFramework::Dump(DescriptiveFramework *this,FILE *stream)

{
  char *pcVar1;
  char identbuf [128];
  char local_98 [136];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,stream);
  if ((this->LinkedDescriptiveFrameworkPlugInId).m_has_value == true) {
    pcVar1 = Kumu::UUID::EncodeString
                       (&(this->LinkedDescriptiveFrameworkPlugInId).m_property,local_98,0x80);
    fprintf((FILE *)stream,"  %22s = %s\n","LinkedDescriptiveFrameworkPlugInId",pcVar1);
  }
  return;
}

Assistant:

void
DescriptiveFramework::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  if ( ! LinkedDescriptiveFrameworkPlugInId.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "LinkedDescriptiveFrameworkPlugInId", LinkedDescriptiveFrameworkPlugInId.get().EncodeString(identbuf, IdentBufferLen));
  }
}